

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  JsonParse *pParse;
  char *zPath;
  JsonNode *pNode;
  sqlite3_value **aReplace;
  ulong uVar3;
  ulong uVar4;
  JsonString jx;
  JsonString local_b8;
  
  if ((1 < argc) && (pParse = jsonParseCached(ctx,argv,ctx), pParse != (JsonParse *)0x0)) {
    local_b8.zBuf = local_b8.zSpace;
    local_b8.nAlloc = 100;
    local_b8.nUsed = 0;
    local_b8.bStatic = '\x01';
    local_b8.bErr = '\0';
    local_b8.pCtx = ctx;
    jsonAppendChar(&local_b8,'[');
    uVar3 = 1;
    do {
      zPath = (char *)sqlite3ValueText(argv[uVar3],'\x01');
      pNode = jsonLookup(pParse,zPath,(int *)0x0,ctx);
      uVar4 = uVar3;
      if (pParse->nErr != '\0') break;
      if (argc == 2) {
        if (pNode != (JsonNode *)0x0) {
          jsonReturn(pNode,ctx,aReplace);
        }
      }
      else {
        if ((local_b8.nUsed != 0) && ((local_b8.zBuf[local_b8.nUsed - 1] & 0xdfU) != 0x5b)) {
          jsonAppendChar(&local_b8,',');
        }
        if (pNode == (JsonNode *)0x0) {
          jsonAppendRaw(&local_b8,"null",4);
        }
        else {
          jsonRenderNode(pNode,&local_b8,(sqlite3_value **)0x0);
        }
      }
      uVar3 = uVar3 + 1;
      uVar4 = (ulong)(uint)argc;
    } while ((uint)argc != uVar3);
    if ((int)uVar4 == argc && argc != 2) {
      jsonAppendChar(&local_b8,']');
      if (local_b8.bErr == '\0') {
        sqlite3_result_text64
                  (local_b8.pCtx,local_b8.zBuf,local_b8.nUsed,
                   (_func_void_void_ptr *)(-(ulong)(local_b8.bStatic != '\0') | 0x1314d2),'\x01');
        local_b8.zBuf = local_b8.zSpace;
        local_b8.nAlloc = 100;
        local_b8.nUsed = 0;
        local_b8.bStatic = '\x01';
      }
      pMVar2 = ctx->pOut;
      pMVar2->eSubtype = 'J';
      pbVar1 = (byte *)((long)&pMVar2->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if (local_b8.bStatic == '\0') {
      sqlite3_free(local_b8.zBuf);
    }
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  JsonString jx;
  int i;

  if( argc<2 ) return;
  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '[');
  for(i=1; i<argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    pNode = jsonLookup(p, zPath, 0, ctx);
    if( p->nErr ) break;
    if( argc>2 ){
      jsonAppendSeparator(&jx);
      if( pNode ){
        jsonRenderNode(pNode, &jx, 0);
      }else{
        jsonAppendRaw(&jx, "null", 4);
      }
    }else if( pNode ){
      jsonReturn(pNode, ctx, 0);
    }
  }
  if( argc>2 && i==argc ){
    jsonAppendChar(&jx, ']');
    jsonResult(&jx);
    sqlite3_result_subtype(ctx, JSON_SUBTYPE);
  }
  jsonReset(&jx);
}